

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> * __thiscall
Test::Suite::listTests
          (vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>
           *__return_storage_ptr__,Suite *this)

{
  pointer pTVar1;
  pointer psVar2;
  pointer pTVar3;
  pointer __lhs;
  pointer psVar4;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->testMethods).
                    super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->testMethods).
                   super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  pTVar1 = (this->testMethods).
           super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar3 = (this->testMethods).
           super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (__lhs = pTVar3; __lhs != pTVar1; __lhs = __lhs + 1) {
    tmp.super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::operator+(&local_70,&__lhs->name,"(");
    std::operator+(&local_50,&local_70,&__lhs->argString);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &tmp.
                    super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&local_50,")");
    std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::
    emplace_back<Test::TestMethodInfo>(__return_storage_ptr__,(TestMethodInfo *)&tmp);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &tmp.super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string(&local_50);
    std::__cxx11::string::~string(&local_70);
    pTVar3 = pTVar3 + 1;
  }
  psVar2 = (this->subSuites).
           super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->subSuites).
                super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1) {
    (*((psVar4->super___shared_ptr<Test::Suite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Suite[4]
    )(&tmp);
    std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo*,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>>>,void>
              ((vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
               _M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>_>
                )tmp.super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<Test::TestMethodInfo_*,_std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>_>_>
                )tmp.super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::~vector(&tmp);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestMethodInfo> Suite::listTests() const {
  std::vector<TestMethodInfo> result;
  result.reserve(testMethods.size());
  for (const auto &method : testMethods) {
    result.emplace_back(
        TestMethodInfo{reinterpret_cast<std::uintptr_t>(&method), method.name + "(" + method.argString + ")"});
  }
  for (const auto &suite : subSuites) {
    auto tmp = suite->listTests();
    result.insert(result.end(), std::make_move_iterator(tmp.begin()), std::make_move_iterator(tmp.end()));
  }
  return result;
}